

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserColour.cpp
# Opt level: O1

void Rml::HSLAToRGBA(Array<float,_4> *vals)

{
  float l;
  float h;
  float fVar1;
  float fVar2;
  
  if ((vals->_M_elems[1] != 0.0) || (NAN(vals->_M_elems[1]))) {
    fVar1 = fmodf(vals->_M_elems[0],360.0);
    h = (float)(~-(uint)(fVar1 < 0.0) & (uint)fVar1 | (uint)(fVar1 + 360.0) & -(uint)(fVar1 < 0.0));
    fVar1 = vals->_M_elems[1];
    l = vals->_M_elems[2];
    fVar2 = HSL_f(h,fVar1,l,0.0);
    vals->_M_elems[0] = fVar2;
    fVar2 = HSL_f(h,fVar1,l,8.0);
    vals->_M_elems[1] = fVar2;
    fVar1 = HSL_f(h,fVar1,l,4.0);
    vals->_M_elems[2] = fVar1;
  }
  else {
    vals->_M_elems[1] = vals->_M_elems[2];
    vals->_M_elems[0] = vals->_M_elems[2];
  }
  return;
}

Assistant:

static void HSLAToRGBA(Array<float, 4>& vals)
{
	if (vals[1] == 0.0f)
	{
		vals[0] = vals[1] = vals[2];
	}
	else
	{
		float h = std::fmod(vals[0], 360.0f);
		if (h < 0)
			h += 360.0f;
		float s = vals[1];
		float l = vals[2];
		vals[0] = HSL_f(h, s, l, 0.0f);
		vals[1] = HSL_f(h, s, l, 8.0f);
		vals[2] = HSL_f(h, s, l, 4.0f);
	}
}